

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

void __thiscall duckdb::SingleFileBlockManager::LoadExistingDatabase(SingleFileBlockManager *this)

{
  FileBuffer *block;
  optional_idx *this_00;
  bool bVar1;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var2;
  pointer pcVar3;
  ulong uVar4;
  FileSystem *pFVar5;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var6;
  type handle;
  idx_t iVar7;
  CatalogException *pCVar8;
  IOException *this_01;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  DatabaseHeader *header;
  MainHeader main_header;
  DatabaseHeader local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  MainHeader local_c8;
  DatabaseHeader local_60;
  
  uVar4 = (ulong)(this->options).read_only;
  uVar9 = 3;
  if (uVar4 != 0) {
    uVar9 = 0x81;
  }
  uVar10 = uVar9 + 4;
  if ((this->options).use_direct_io == false) {
    uVar10 = uVar9;
  }
  pFVar5 = FileSystem::Get(this->db);
  (*pFVar5->_vptr_FileSystem[2])(&local_c8,pFVar5,&this->path,uVar10 | 0x100,0x102 - uVar4,0);
  _Var6._M_head_impl = (FileHandle *)local_c8.version_number;
  local_c8.version_number = 0;
  _Var2._M_head_impl =
       (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
       ._M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = _Var6._M_head_impl;
  if (_Var2._M_head_impl != (FileHandle *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_FileHandle + 8))();
    if ((long *)local_c8.version_number != (long *)0x0) {
      (**(code **)(*(long *)local_c8.version_number + 8))();
    }
    _Var6._M_head_impl =
         (this->handle).
         super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
         super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  }
  if (_Var6._M_head_impl != (FileHandle *)0x0) {
    handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*(&this->handle);
    MainHeader::CheckMagicBytes(handle);
    block = &this->header_buffer;
    lVar11 = 0;
    ReadAndChecksum(this,block,0,true);
    if ((this->super_BlockManager).block_header_size.index != 0xffffffffffffffff) {
      this_00 = &(this->super_BlockManager).block_header_size;
      iVar7 = optional_idx::GetIndex(this_00);
      lVar11 = 0;
      if ((8 < iVar7) && (this_00->index != 0xffffffffffffffff)) {
        iVar7 = optional_idx::GetIndex(this_00);
        lVar11 = 8 - iVar7;
      }
    }
    DeserializeMainHeader(&local_c8,(this->header_buffer).buffer + lVar11);
    bVar1 = (this->options).encryption;
    if (local_c8.flags[0] == 1) {
      if (bVar1 == false) {
        pCVar8 = (CatalogException *)__cxa_allocate_exception(0x10);
        local_160.iteration = (uint64_t)&local_160.free_list;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,"Cannot open encrypted database \"%s\" without a key","");
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        pcVar3 = (this->path)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar3,pcVar3 + (this->path)._M_string_length);
        CatalogException::CatalogException<std::__cxx11::string>
                  (pCVar8,(string *)&local_160,&local_108);
        __cxa_throw(pCVar8,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else if (bVar1 != false) {
      pCVar8 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_160.iteration = (uint64_t)&local_160.free_list;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_160,"A key is specified, but database \"%s\" is not encrypted","")
      ;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      pcVar3 = (this->path)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar3,pcVar3 + (this->path)._M_string_length);
      CatalogException::CatalogException<std::__cxx11::string>
                (pCVar8,(string *)&local_160,&local_128);
      __cxa_throw(pCVar8,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_idx::optional_idx((optional_idx *)&local_160,local_c8.version_number);
    (this->options).version_number.index = local_160.iteration;
    ReadAndChecksum(this,block,0x1000,false);
    DeserializeDatabaseHeader(&local_160,&local_c8,(this->header_buffer).buffer);
    ReadAndChecksum(this,block,0x2000,false);
    DeserializeDatabaseHeader(&local_60,&local_c8,(this->header_buffer).buffer);
    this->active_header = local_160.iteration <= local_60.iteration;
    header = &local_160;
    if (local_160.iteration <= local_60.iteration) {
      header = &local_60;
    }
    Initialize(this,header,(optional_idx)(this->super_BlockManager).block_alloc_size.index);
    AddStorageVersionTag(this);
    LoadFreeList(this);
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x10);
  local_c8.version_number = (uint64_t)(local_c8.flags + 1);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,
             "Cannot open database \"%s\" in read-only mode: database does not exist","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  pcVar3 = (this->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar3,pcVar3 + (this->path)._M_string_length);
  IOException::IOException<std::__cxx11::string>(this_01,(string *)&local_c8,&local_e8);
  __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::LoadExistingDatabase() {
	auto flags = GetFileFlags(false);

	// open the RDBMS handle
	auto &fs = FileSystem::Get(db);
	handle = fs.OpenFile(path, flags);
	if (!handle) {
		// this can only happen in read-only mode - as that is when we set FILE_FLAGS_NULL_IF_NOT_EXISTS
		throw IOException("Cannot open database \"%s\" in read-only mode: database does not exist", path);
	}

	MainHeader::CheckMagicBytes(*handle);
	// otherwise, we check the metadata of the file
	ReadAndChecksum(header_buffer, 0, true);

	uint64_t delta = 0;
	if (GetBlockHeaderSize() > DEFAULT_BLOCK_HEADER_STORAGE_SIZE) {
		delta = GetBlockHeaderSize() - DEFAULT_BLOCK_HEADER_STORAGE_SIZE;
	}

	MainHeader main_header = DeserializeMainHeader(header_buffer.buffer - delta);

	if (main_header.IsEncrypted() && !options.NeedsEncryption()) {
		throw CatalogException("Cannot open encrypted database \"%s\" without a key", path);
	}
	if (!main_header.IsEncrypted() && options.NeedsEncryption()) {
		// database is not encrypted, but is tried to be opened with a key
		throw CatalogException("A key is specified, but database \"%s\" is not encrypted", path);
	}

	options.version_number = main_header.version_number;

	// read the database headers from disk
	DatabaseHeader h1;
	ReadAndChecksum(header_buffer, Storage::FILE_HEADER_SIZE);
	h1 = DeserializeDatabaseHeader(main_header, header_buffer.buffer);

	DatabaseHeader h2;
	ReadAndChecksum(header_buffer, Storage::FILE_HEADER_SIZE * 2ULL);
	h2 = DeserializeDatabaseHeader(main_header, header_buffer.buffer);

	// check the header with the highest iteration count
	if (h1.iteration > h2.iteration) {
		// h1 is active header
		active_header = 0;
		Initialize(h1, GetOptionalBlockAllocSize());
	} else {
		// h2 is active header
		active_header = 1;
		Initialize(h2, GetOptionalBlockAllocSize());
	}
	AddStorageVersionTag();
	LoadFreeList();
}